

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_cmdline.cpp
# Opt level: O1

bool __thiscall Omega_h::CmdLine::parse(CmdLine *this,int *p_argc,char **argv,bool should_print)

{
  pointer puVar1;
  CmdLineFlag *pCVar2;
  pointer puVar3;
  __uniq_ptr_data<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>,_true,_true> _Var4
  ;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  bool bVar9;
  ulong uVar10;
  unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_> *flag;
  pointer puVar11;
  bool bVar12;
  bool bVar13;
  int local_70;
  long *local_50 [2];
  long local_40 [2];
  
  bVar12 = 1 < *p_argc;
  if (1 < *p_argc) {
    local_70 = 1;
    do {
      puVar11 = (this->flags_).
                super__Vector_base<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (this->flags_).
               super__Vector_base<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar13 = puVar11 == puVar1;
      if (bVar13) {
        bVar9 = false;
      }
      else {
        bVar5 = false;
        do {
          iVar7 = std::__cxx11::string::compare
                            ((char *)&(((puVar11->_M_t).
                                        super___uniq_ptr_impl<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_Omega_h::CmdLineFlag_*,_std::default_delete<Omega_h::CmdLineFlag>_>
                                        .super__Head_base<0UL,_Omega_h::CmdLineFlag_*,_false>.
                                       _M_head_impl)->super_CmdLineItem).name_);
          bVar6 = true;
          bVar9 = bVar5;
          if (iVar7 == 0) {
            bVar6 = CmdLineItem::parse(&((puVar11->_M_t).
                                         super___uniq_ptr_impl<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_Omega_h::CmdLineFlag_*,_std::default_delete<Omega_h::CmdLineFlag>_>
                                         .super__Head_base<0UL,_Omega_h::CmdLineFlag_*,_false>.
                                        _M_head_impl)->super_CmdLineItem,p_argc,argv,local_70,
                                       should_print);
            if (bVar6) {
              bVar9 = true;
            }
            if (!bVar6 && should_print) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"failed to parse flag ",0x15);
              pCVar2 = (puVar11->_M_t).
                       super___uniq_ptr_impl<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Omega_h::CmdLineFlag_*,_std::default_delete<Omega_h::CmdLineFlag>_>
                       .super__Head_base<0UL,_Omega_h::CmdLineFlag_*,_false>._M_head_impl;
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,
                                  (pCVar2->super_CmdLineItem).name_._M_dataplus._M_p,
                                  *(size_type *)((long)&(pCVar2->super_CmdLineItem).name_ + 8));
              local_50[0] = (long *)CONCAT71(local_50[0]._1_7_,10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_50,1);
              bVar6 = false;
              bVar9 = bVar5;
            }
          }
          if (bVar6 == false) {
            iVar7 = 1;
            goto LAB_0024acda;
          }
          puVar11 = puVar11 + 1;
          bVar13 = puVar11 == puVar1;
          bVar5 = bVar9;
        } while (!bVar13);
      }
      iVar7 = 4;
LAB_0024acda:
      if ((bVar13) && (iVar7 = 3, !bVar9)) {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"--help","");
        iVar7 = std::__cxx11::string::compare((char *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        if (iVar7 == 0) {
          this->parsed_help_ = true;
        }
        else {
          puVar3 = (this->args_).
                   super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (this->nargs_parsed_ <
              (ulong)((long)(this->args_).
                            super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3)) {
            bVar13 = CmdLineItem::parse((CmdLineItem *)
                                        puVar3[this->nargs_parsed_]._M_t.
                                        super___uniq_ptr_impl<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>
                                        ,p_argc,argv,local_70,should_print);
            iVar7 = 0;
            if (bVar13) {
              this->nargs_parsed_ = this->nargs_parsed_ + 1;
            }
            goto LAB_0024ad99;
          }
        }
        local_70 = local_70 + 1;
        iVar7 = 0;
      }
LAB_0024ad99:
      if ((iVar7 != 3) && (iVar7 != 0)) {
        if (bVar12) goto LAB_0024ae56;
        break;
      }
      bVar12 = local_70 < *p_argc;
    } while (local_70 < *p_argc);
  }
  uVar10 = this->nargs_parsed_;
  bVar12 = (ulong)((long)(this->args_).
                         super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->args_).
                         super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar10;
  if (should_print && !bVar12) {
    if (uVar10 < (ulong)((long)(this->args_).
                               super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->args_).
                               super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"missing required argument <",0x1b);
        _Var4.
        super___uniq_ptr_impl<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>._M_t
        .super__Tuple_impl<0UL,_Omega_h::CmdLineItem_*,_std::default_delete<Omega_h::CmdLineItem>_>.
        super__Head_base<0UL,_Omega_h::CmdLineItem_*,_false>._M_head_impl =
             (this->args_).
             super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_t.
             super___uniq_ptr_impl<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>
        ;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            *(char **)((long)_Var4.
                                             super___uniq_ptr_impl<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_Omega_h::CmdLineItem_*,_std::default_delete<Omega_h::CmdLineItem>_>
                                             .super__Head_base<0UL,_Omega_h::CmdLineItem_*,_false>.
                                             _M_head_impl + 8),
                            *(long *)((long)_Var4.
                                            super___uniq_ptr_impl<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_Omega_h::CmdLineItem_*,_std::default_delete<Omega_h::CmdLineItem>_>
                                            .super__Head_base<0UL,_Omega_h::CmdLineItem_*,_false>.
                                            _M_head_impl + 0x10));
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,">\n",2);
        uVar10 = uVar10 + 1;
      } while (uVar10 < (ulong)((long)(this->args_).
                                      super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->args_).
                                      super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
LAB_0024ae56:
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

bool CmdLine::parse(int* p_argc, char** argv, bool should_print) {
  for (int i = 1; i < *p_argc;) {
    bool parsed_by_flag = false;
    for (auto const& flag : flags_) {
      if (flag->name() == argv[i]) {
        if (!flag->parse(p_argc, argv, i, should_print)) {
          if (should_print) {
            std::cout << "failed to parse flag " << flag->name() << '\n';
          }
          return false;
        }
        parsed_by_flag = true;
      }
    }
    if (parsed_by_flag) {
      continue;
    } else if (std::string("--help") == argv[i]) {
      parsed_help_ = true;
      ++i;
    } else if (args_.size() > nargs_parsed_) {
      if (args_[nargs_parsed_]->parse(p_argc, argv, i, should_print)) {
        ++nargs_parsed_;
      }
    } else {
      ++i;
    }
  }
  if (nargs_parsed_ < args_.size()) {
    if (should_print) {
      for (std::size_t i = nargs_parsed_; i < args_.size(); ++i) {
        std::cout << "missing required argument <" << args_[i]->name() << ">\n";
      }
    }
    return false;
  }
  return true;
}